

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sipc.c
# Opt level: O3

int nn_sipc_recv(nn_pipebase *self,nn_msg *msg)

{
  nn_fsm_event *pnVar1;
  
  pnVar1 = &self[-3].in;
  if (self == (nn_pipebase *)0x0) {
    pnVar1 = (nn_fsm_event *)0x0;
  }
  if (((nn_ep_options *)(pnVar1 + 2))->ipv4only == 4) {
    if (*(int *)((long)(pnVar1 + 0x12) + 0x18) == 3) {
      nn_msg_mv(msg,(nn_msg *)(pnVar1 + 0x13));
      nn_msg_init((nn_msg *)(pnVar1 + 0x13),0);
      *(undefined4 *)((long)(pnVar1 + 0x12) + 0x18) = 1;
      nn_usock_recv(*(nn_usock **)((long)((nn_ep_options *)(pnVar1 + 2) + 1) + 4),
                    (void *)((long)(pnVar1 + 0x12) + 0x1c),9,(int *)0x0);
      return 0;
    }
  }
  else {
    nn_sipc_recv_cold_1();
  }
  nn_sipc_recv_cold_2();
}

Assistant:

static int nn_sipc_recv (struct nn_pipebase *self, struct nn_msg *msg)
{
    struct nn_sipc *sipc;

    sipc = nn_cont (self, struct nn_sipc, pipebase);

    nn_assert_state (sipc, NN_SIPC_STATE_ACTIVE);
    nn_assert (sipc->instate == NN_SIPC_INSTATE_HASMSG);

    /*  Move received message to the user. */
    nn_msg_mv (msg, &sipc->inmsg);
    nn_msg_init (&sipc->inmsg, 0);

    /*  Start receiving new message. */
    sipc->instate = NN_SIPC_INSTATE_HDR;
    nn_usock_recv (sipc->usock, sipc->inhdr, sizeof (sipc->inhdr), NULL);

    return 0;
}